

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(int16_t *src,float *dst,uint32_t len)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i b;
  __m128i a;
  __m128i ints;
  __m128 divby32768;
  SDL_AssertState sdl_assert_state;
  int i;
  int local_170;
  float *local_168;
  short *local_160;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  
  local_160 = (short *)(in_RDI + (ulong)(in_EDX - 1) * 2);
  local_168 = (float *)(in_RSI + (ulong)(in_EDX - 1) * 4);
  for (local_170 = in_EDX; local_170 != 0 && ((ulong)(local_168 + -7) & 0xf) != 0;
      local_170 = local_170 + -1) {
    *local_168 = (float)(int)*local_160 * 3.0517578e-05;
    local_160 = local_160 + -1;
    local_168 = local_168 + -1;
  }
  local_160 = local_160 + -7;
  local_168 = local_168 + -7;
  do {
    if (local_170 == 0 || ((ulong)local_168 & 0xf) == 0) goto LAB_001320fe;
    iVar3 = SDL_ReportAssertion(&FAudio_INTERNAL_Convert_S16_To_F32_SSE2::sdl_assert_data,
                                "FAudio_INTERNAL_Convert_S16_To_F32_SSE2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_internal_simd.c"
                                ,0xc4);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_001320fe:
  if (((ulong)local_160 & 0xf) == 0) {
    for (; 7 < local_170; local_170 = local_170 + -8) {
      local_58 = (int)*(undefined8 *)local_160;
      iStack_54 = (int)((ulong)*(undefined8 *)local_160 >> 0x20);
      iStack_50 = (int)*(undefined8 *)(local_160 + 4);
      iStack_4c = (int)((ulong)*(undefined8 *)(local_160 + 4) >> 0x20);
      auVar4 = ZEXT416(0x10);
      auVar5 = ZEXT416(0x10);
      *(ulong *)local_168 =
           CONCAT44((float)(local_58 >> auVar5) * 3.0517578e-05,
                    (float)((local_58 << 0x10) >> auVar4) * 3.0517578e-05);
      *(ulong *)(local_168 + 2) =
           CONCAT44((float)(iStack_54 >> auVar5) * 3.0517578e-05,
                    (float)(iStack_54 >> auVar4) * 3.0517578e-05);
      auVar2._4_4_ = (float)(iStack_50 >> auVar5) * 3.0517578e-05;
      auVar2._0_4_ = (float)(iStack_50 >> auVar4) * 3.0517578e-05;
      auVar2._8_4_ = (float)(iStack_4c >> auVar4) * 3.0517578e-05;
      auVar2._12_4_ = (float)(iStack_4c >> auVar5) * 3.0517578e-05;
      *(undefined1 (*) [16])(local_168 + 4) = auVar2;
      local_160 = local_160 + -8;
      local_168 = local_168 + -8;
    }
  }
  local_160 = local_160 + 7;
  local_168 = local_168 + 7;
  for (; local_170 != 0; local_170 = local_170 + -1) {
    *local_168 = (float)(int)*local_160 * 3.0517578e-05;
    local_160 = local_160 + -1;
    local_168 = local_168 + -1;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(
	const int16_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-7)) & 15); --i, --src, --dst) {
        *dst = ((float) *src) * DIVBY32768;
    }

    src -= 7; dst -= 7;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby32768 = _mm_set1_ps(DIVBY32768);
        while (i >= 8) {   /* 8 * 16-bit */
            const __m128i ints = _mm_load_si128((__m128i const *) src);  /* get 8 sint16 into an XMM register. */
            /* treat as int32, shift left to clear every other sint16, then back right with sign-extend. Now sint32. */
            const __m128i a = _mm_srai_epi32(_mm_slli_epi32(ints, 16), 16);
            /* right-shift-sign-extend gets us sint32 with the other set of values. */
            const __m128i b = _mm_srai_epi32(ints, 16);
            /* Interleave these back into the right order, convert to float, multiply, store. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi32(a, b)), divby32768));
            _mm_store_ps(dst+4, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi32(a, b)), divby32768));
            i -= 8; src -= 8; dst -= 8;
        }
    }

    src += 7; dst += 7;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) *src) * DIVBY32768;
        i--; src--; dst--;
    }
}